

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_variableNotEqualById_Test::~Equality_variableNotEqualById_Test
          (Equality_variableNotEqualById_Test *this)

{
  Equality_variableNotEqualById_Test *this_local;
  
  ~Equality_variableNotEqualById_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, variableNotEqualById)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create("variable");
    libcellml::VariablePtr v2 = libcellml::Variable::create("variable");

    v1->setId("eijei3009");
    v2->setId("lefisjeij");

    EXPECT_FALSE(v1->equals(v2));
    EXPECT_FALSE(v2->equals(v1));
}